

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_AddTxOut_RemoveTxOut_Test::TestBody(Transaction_AddTxOut_RemoveTxOut_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  char *pcVar3;
  AssertHelperData *pAVar4;
  AssertionResult gtest_ar_7;
  TxOutReference txout_ref;
  Transaction tx;
  Script script;
  AssertHelper local_250;
  undefined1 local_248;
  AssertHelper local_240;
  undefined1 local_238;
  AssertHelper local_230;
  AssertHelper local_228;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  undefined1 local_218;
  Script local_210;
  undefined1 local_1d8 [80];
  Script local_188;
  Script local_148;
  long local_110;
  undefined **local_108 [3];
  Script local_f0;
  undefined **local_b8 [3];
  Script local_a0;
  undefined **local_68 [3];
  Script local_50;
  
  cfd::core::Transaction::Transaction((Transaction *)&local_188,2,0);
  local_1d8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10)
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac","");
  cfd::core::Script::Script(&local_148,(string *)local_1d8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10))
  {
    operator_delete((void *)local_1d8._0_8_);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1d8._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_1d8[8] = extraout_DL;
      cfd::core::Transaction::AddTxOut((Amount *)&local_188,(Script *)local_1d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17d,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
  }
  local_228.data_._0_4_ = cfd::core::Transaction::GetTxOutCount();
  local_250.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1d8,"tx.GetTxOutCount()","1",(uint *)&local_228,(int *)&local_250);
  if (local_1d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_228);
    if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(Type *)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_228.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)local_68);
      local_68[0] = &PTR__AbstractTxOutReference_004d2e58;
      cfd::core::Script::~Script(&local_50);
    }
  }
  else {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17f,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
  }
  local_228.data_ = local_228.data_ & 0xffffffff00000000;
  uVar2 = cfd::core::Transaction::GetTxOutIndex(&local_188);
  local_250.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_1d8,"0","tx.GetTxOutIndex(script)",(int *)&local_228,
             (uint *)&local_250);
  if (local_1d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_228);
    if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(Type *)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_228.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1d8._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_1d8[8] = extraout_DL_00;
      cfd::core::Transaction::AddTxOut((Amount *)&local_188,(Script *)local_1d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x182,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
  }
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  local_228.data_._0_4_ = uVar2;
  local_250.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1d8,"tx.GetTxOutCount()","2",(uint *)&local_228,(int *)&local_250);
  if (local_1d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_228);
    if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(Type *)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_228.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)local_b8);
      local_b8[0] = &PTR__AbstractTxOutReference_004d2e58;
      cfd::core::Script::~Script(&local_a0);
    }
  }
  else {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x184,"Expected: tx.GetTxOut(1) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
  }
  local_228.data_ = local_228.data_ & 0xffffffff00000000;
  uVar2 = cfd::core::Transaction::GetTxOutIndex(&local_188);
  local_250.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_1d8,"0","tx.GetTxOutIndex(script)",(int *)&local_228,
             (uint *)&local_250);
  if (local_1d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_228);
    if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(Type *)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x185,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_228.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    rhs = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar4 = (AssertHelperData *)0x0;
    if (bVar1) {
      cfd::core::Transaction::GetTxOutIndexList((Script *)local_1d8);
      rhs = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1d8._0_8_;
      pAVar4 = (AssertHelperData *)local_1d8._8_8_;
    }
  }
  else {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x187,
               "Expected: (index_list = tx.GetTxOutIndexList(script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
    rhs = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar4 = (AssertHelperData *)0x0;
  }
  local_250.data_._0_4_ = 2;
  local_228.data_ = (AssertHelperData *)((long)pAVar4 - (long)rhs >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_1d8,"2","index_list.size()",(int *)&local_250,
             (unsigned_long *)&local_228);
  if (local_1d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_228);
    if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(Type *)local_1d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x188,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_228.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)pAVar4 - (long)rhs == 8) {
    local_228.data_ = local_228.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_1d8,"0","index_list[0]",(int *)&local_228,(uint *)rhs);
    if (local_1d8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_228);
      if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)(Type *)local_1d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      if (local_228.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_228.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_1d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_228.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_1d8,"1","index_list[1]",(int *)&local_228,(uint *)(rhs + 4));
    if (local_1d8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_228);
      if ((AssertHelperData *)local_1d8._8_8_ == (AssertHelperData *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)(Type *)local_1d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      if (local_228.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(undefined **)local_228.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_1d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_250.data_ = (AssertHelperData *)cfd::core::Amount::CreateBySatoshiAmount(0x74cbb1);
  local_248 = extraout_DL_01;
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_1d8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetTxOutValue((uint)&local_188,(Amount *)0x1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x191,
               "Expected: tx.SetTxOutValue(1, amt2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_228.data_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)&local_228);
      local_1d8[0x10] = local_218;
      local_1d8._8_8_ = local_220.ptr_;
      cfd::core::Script::operator=((Script *)(local_1d8 + 0x18),&local_210);
      local_228.data_ = (AssertHelperData *)&PTR__AbstractTxOutReference_004d2e58;
      cfd::core::Script::~Script(&local_210);
    }
  }
  else {
    testing::Message::Message((Message *)&local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x192,
               "Expected: (txout_ref = tx.GetTxOut(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_228.data_ + 8))();
      }
    }
  }
  local_240.data_ = (AssertHelperData *)local_1d8._8_8_;
  local_238 = local_1d8[0x10];
  local_230.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_110 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_228,"txout_ref.GetValue().GetSatoshiValue()",
             "amt2.GetSatoshiValue()",(long *)&local_230,&local_110);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_240);
    if ((AssertHelperData *)local_220.ptr_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_240.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_240.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_240.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((uint)&local_188);
    }
  }
  else {
    testing::Message::Message((Message *)&local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x196,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_228.data_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((uint)&local_188);
    }
  }
  else {
    testing::Message::Message((Message *)&local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x197,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_228.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_228.data_ + 8))();
      }
    }
  }
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  local_240.data_._0_4_ = uVar2;
  local_230.data_ = local_230.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_228,"tx.GetTxOutCount()","0",(uint *)&local_240,(int *)&local_230);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_240);
    if ((AssertHelperData *)local_220.ptr_ == (AssertHelperData *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x198,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_240.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_240.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_240.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::GetTxOut((uint)local_108);
    local_108[0] = &PTR__AbstractTxOutReference_004d2e58;
    cfd::core::Script::~Script(&local_f0);
  }
  testing::Message::Message((Message *)&local_228);
  testing::internal::AssertHelper::AssertHelper
            (&local_240,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x199,
             "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
  testing::internal::AssertHelper::~AssertHelper(&local_240);
  if (local_228.data_ != (AssertHelperData *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_228.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(undefined **)local_228.data_ + 8))();
    }
  }
  local_1d8._0_8_ = &PTR__AbstractTxOutReference_004d2e58;
  cfd::core::Script::~Script((Script *)(local_1d8 + 0x18));
  if (rhs != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(rhs);
  }
  cfd::core::Script::~Script(&local_148);
  cfd::core::Transaction::~Transaction((Transaction *)&local_188);
  return;
}

Assistant:

TEST(Transaction, AddTxOut_RemoveTxOut) {
  Transaction tx(exp_version, exp_locktime);
  Script script("76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac");

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(tx.GetTxOut(0));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW(tx.GetTxOut(1));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW((index_list = tx.GetTxOutIndexList(script)));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(1, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  TxOutReference txout_ref;
  EXPECT_NO_THROW(tx.SetTxOutValue(1, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(1)));
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(),
            amt2.GetSatoshiValue());

  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  EXPECT_THROW(tx.GetTxOut(0), CfdException);
}